

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O0

void __thiscall
Assimp::ZipArchiveIOSystem::ZipArchiveIOSystem
          (ZipArchiveIOSystem *this,IOSystem *pIOHandler,string *rFilename,char *pMode)

{
  Implement *this_00;
  char *pFilename;
  char *pMode_local;
  string *rFilename_local;
  IOSystem *pIOHandler_local;
  ZipArchiveIOSystem *this_local;
  
  IOSystem::IOSystem(&this->super_IOSystem);
  (this->super_IOSystem)._vptr_IOSystem = (_func_int **)&PTR__ZipArchiveIOSystem_00fbb260;
  this_00 = (Implement *)operator_new(0x38);
  pFilename = (char *)std::__cxx11::string::c_str();
  Implement::Implement(this_00,pIOHandler,pFilename,pMode);
  this->pImpl = this_00;
  return;
}

Assistant:

ZipArchiveIOSystem::ZipArchiveIOSystem(IOSystem* pIOHandler, const std::string& rFilename, const char* pMode)
        : pImpl(new Implement(pIOHandler, rFilename.c_str(), pMode))
    {
    }